

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O0

int __thiscall
soplex::SPxHarrisRT<double>::selectLeave
          (SPxHarrisRT<double> *this,double *val,double param_3,bool param_4)

{
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  SSVectorBase<double> *this_00;
  long *plVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  SSVectorBase<double> *pSVar8;
  double *pdVar9;
  char *pcVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar11;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  double *in_RSI;
  long *in_RDI;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  VectorBase<double> *low;
  VectorBase<double> *up;
  VectorBase<double> *vec;
  SSVectorBase<double> *upd;
  double degeneps;
  double epsilon;
  double maxabs;
  int leave;
  double useeps;
  double lastshift;
  double sel;
  double max;
  double y;
  double x;
  double stab;
  int j;
  int i;
  int n;
  SSVectorBase<double> *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  SPxSolverBase<double> *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  SPxSolverBase<double> *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  SPxHarrisRT<double> *in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  double *in_stack_ffffffffffffff40;
  int local_6c;
  double local_68;
  double local_58;
  double local_38;
  uint local_2c;
  int local_4;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_6c = -1;
  (**(code **)(*in_RDI + 0x18))();
  dVar12 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x2b4bb5);
  dVar13 = degenerateEps((SPxHarrisRT<double> *)in_stack_fffffffffffffe90);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  pUVar3 = SPxSolverBase<double>::fVec(pSVar2);
  this_00 = UpdateVector<double>::delta(pUVar3);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<double>::fVec(pSVar2);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<double>::ubBound(pSVar2);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<double>::lbBound(pSVar2);
  dVar17 = *in_RSI;
  plVar4 = (long *)(**(code **)(*in_RDI + 0x18))();
  dVar14 = (double)(**(code **)(*plVar4 + 0x368))();
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  pUVar3 = SPxSolverBase<double>::fVec(pSVar2);
  UpdateVector<double>::delta(pUVar3);
  SSVectorBase<double>::setup(in_stack_fffffffffffffe90);
  if (dVar17 <= dVar12) {
    if (-dVar12 <= dVar17) {
      return -1;
    }
    SSVectorBase<double>::size((SSVectorBase<double> *)0x2b5257);
    SSVectorBase<double>::indexMem(this_00);
    SSVectorBase<double>::values((SSVectorBase<double> *)0x2b527a);
    pdVar5 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b528c);
    pSVar8 = (SSVectorBase<double> *)
             VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b529e);
    pdVar6 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b52b0);
    minDelta(in_stack_ffffffffffffff20,
             (double *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10,iVar1,
             (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff40);
    if ((dVar17 == *in_RSI) && (!NAN(dVar17) && !NAN(*in_RSI))) {
      return -1;
    }
    local_38 = 0.0;
    pdVar7 = (double *)infinity();
    local_58 = *pdVar7;
    local_68 = dVar12 * 1.0 * 0.001;
    if (local_68 < dVar12) {
      local_68 = dVar12;
    }
    local_2c = SSVectorBase<double>::size((SSVectorBase<double> *)0x2b5398);
    uVar11 = extraout_RDX_05;
    while (local_2c = local_2c - 1, -1 < (int)local_2c) {
      pcVar10 = SSVectorBase<double>::index(this_00,(char *)(ulong)local_2c,(int)uVar11);
      iVar1 = (int)pcVar10;
      dVar15 = SSVectorBase<double>::operator[](pSVar8,(int)((ulong)pdVar5 >> 0x20));
      n = (int)((ulong)pdVar5 >> 0x20);
      if (-local_68 <= dVar15) {
        if (dVar15 <= local_68) {
          SSVectorBase<double>::clearNum(in_stack_fffffffffffffe90,(int)((ulong)pdVar6 >> 0x20));
          uVar11 = extraout_RDX_10;
        }
        else {
          pdVar7 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar8,n);
          in_stack_fffffffffffffeb0 = (SPxSolverBase<double> *)*pdVar7;
          pdVar7 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)pSVar8,(int)((ulong)pdVar5 >> 0x20));
          if ((double)in_stack_fffffffffffffeb0 - *pdVar7 <= dVar13) {
            dVar16 = ((double)in_stack_fffffffffffffeb0 - *pdVar7) / dVar15;
            uVar11 = extraout_RDX_08;
            if (((dVar17 <= dVar16) && (dVar16 < local_58 + dVar12)) && (local_38 < dVar15)) {
              local_6c = iVar1;
              local_58 = dVar16;
              local_38 = dVar15;
            }
          }
          else {
            in_stack_fffffffffffffea0 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)pSVar8,(int)((ulong)pdVar5 >> 0x20));
            SPxSolverBase<double>::shiftLBbound
                      (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                       (double)in_stack_fffffffffffffe90);
            uVar11 = extraout_RDX_09;
            in_stack_fffffffffffffeac = iVar1;
          }
        }
      }
      else {
        pdVar7 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar8,n);
        dVar16 = *pdVar7;
        pdVar7 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)pSVar8,(int)((ulong)pdVar5 >> 0x20));
        if (-dVar13 <= dVar16 - *pdVar7) {
          dVar16 = (dVar16 - *pdVar7) / dVar15;
          uVar11 = extraout_RDX_06;
          if (((dVar17 <= dVar16) && (dVar16 < local_58 + dVar12)) && (local_38 < -dVar15)) {
            local_38 = -dVar15;
            local_6c = iVar1;
            local_58 = dVar16;
          }
        }
        else {
          (**(code **)(*in_RDI + 0x18))();
          VectorBase<double>::operator[]((VectorBase<double> *)pSVar8,(int)((ulong)pdVar5 >> 0x20));
          SPxSolverBase<double>::shiftUBbound
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                     (double)in_stack_fffffffffffffea0);
          uVar11 = extraout_RDX_07;
        }
      }
    }
  }
  else {
    SSVectorBase<double>::size((SSVectorBase<double> *)0x2b4cd7);
    pdVar5 = (double *)SSVectorBase<double>::indexMem(this_00);
    pdVar6 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2b4d00);
    pdVar7 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b4d15);
    pSVar8 = (SSVectorBase<double> *)
             VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b4d2a);
    pdVar9 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b4d3f);
    maxDelta(in_stack_ffffffffffffff20,
             (double *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10,iVar1,
             (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8,pdVar5,pdVar6,pdVar7);
    if ((dVar17 == *in_RSI) && (!NAN(dVar17) && !NAN(*in_RSI))) {
      return -1;
    }
    local_38 = 0.0;
    pdVar5 = (double *)infinity();
    dVar15 = *pdVar5;
    local_68 = dVar12 * 1.0 * 0.001;
    if (local_68 < dVar12) {
      local_68 = dVar12;
    }
    local_2c = SSVectorBase<double>::size((SSVectorBase<double> *)0x2b4e4d);
    uVar11 = extraout_RDX;
    local_58 = -dVar15;
    while (local_2c = local_2c - 1, -1 < (int)local_2c) {
      pcVar10 = SSVectorBase<double>::index(this_00,(char *)(ulong)local_2c,(int)uVar11);
      dVar15 = SSVectorBase<double>::operator[](pSVar8,(int)((ulong)pdVar7 >> 0x20));
      iVar1 = (int)((ulong)pdVar7 >> 0x20);
      if (dVar15 <= local_68) {
        if (-local_68 <= dVar15) {
          SSVectorBase<double>::clearNum(in_stack_fffffffffffffe90,(int)((ulong)pdVar9 >> 0x20));
          uVar11 = extraout_RDX_04;
        }
        else {
          pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar8,iVar1);
          dVar16 = *pdVar5;
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)pSVar8,(int)((ulong)pdVar7 >> 0x20));
          if (dVar16 - *pdVar5 <= dVar13) {
            dVar16 = (dVar16 - *pdVar5) / dVar15;
            uVar11 = extraout_RDX_02;
            if (((dVar16 <= dVar17) && (local_58 - dVar12 < dVar16)) && (local_38 < -dVar15)) {
              local_6c = (int)pcVar10;
              local_58 = dVar16;
              local_38 = -dVar15;
            }
          }
          else {
            (**(code **)(*in_RDI + 0x18))();
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)pSVar8,(int)((ulong)pdVar7 >> 0x20));
            SPxSolverBase<double>::shiftLBbound
                      (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                       (double)in_stack_fffffffffffffe90);
            uVar11 = extraout_RDX_03;
          }
        }
      }
      else {
        pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar8,iVar1);
        dVar16 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)pSVar8,(int)((ulong)pdVar7 >> 0x20));
        if (-dVar13 <= dVar16 - *pdVar5) {
          dVar16 = (dVar16 - *pdVar5) / dVar15;
          uVar11 = extraout_RDX_00;
          if (((dVar16 <= dVar17) && (local_58 - dVar12 < dVar16)) && (local_38 < dVar15)) {
            local_6c = (int)pcVar10;
            local_58 = dVar16;
            local_38 = dVar15;
          }
        }
        else {
          (**(code **)(*in_RDI + 0x18))();
          VectorBase<double>::operator[]((VectorBase<double> *)pSVar8,(int)((ulong)pdVar7 >> 0x20));
          SPxSolverBase<double>::shiftUBbound
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                     (double)in_stack_fffffffffffffea0);
          uVar11 = extraout_RDX_01;
        }
      }
    }
  }
  plVar4 = (long *)(**(code **)(*in_RDI + 0x18))();
  dVar17 = (double)(**(code **)(*plVar4 + 0x368))();
  if ((dVar14 != dVar17) || (NAN(dVar14) || NAN(dVar17))) {
    local_4 = (**(code **)(*in_RDI + 0x38))(in_RDI,in_RSI,0);
  }
  else {
    *in_RSI = local_58;
    local_4 = local_6c;
  }
  return local_4;
}

Assistant:

int SPxHarrisRT<R>::selectLeave(R& val, R, bool)
{
   int i, j;
   R stab, x, y;
   R max;
   R sel;
   R lastshift;
   R useeps;
   int leave = -1;
   R maxabs = 1;

   R epsilon  = this->solver()->epsilon();
   R degeneps = degenerateEps();

   SSVectorBase<R>& upd = this->solver()->fVec().delta();
   VectorBase<R>& vec = this->solver()->fVec();

   const VectorBase<R>& up = this->solver()->ubBound();
   const VectorBase<R>& low = this->solver()->lbBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   max = val;
   lastshift = this->solver()->shift();

   this->solver()->fVec().delta().setup();

   if(max > epsilon)
   {
      // phase 1:
      maxDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),         /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;


      // phase 2:
      stab = 0;
      sel = R(-infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x > useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else if(x < -useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }


   else if(max < -epsilon)
   {
      // phase 1:
      minDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),                 /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;

      // phase 2:
      stab = 0;
      sel = R(infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x < -useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]);   // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else if(x > useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }

   else
      return -1;


   if(lastshift != this->solver()->shift())
      return selectLeave(val, 0, false);

   assert(leave >= 0);

   val = sel;
   return leave;
}